

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O3

void __thiscall
RGBSpectrum_MaxValue_Test::~RGBSpectrum_MaxValue_Test(RGBSpectrum_MaxValue_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RGBSpectrum, MaxValue) {
    RNG rng;
    for (const auto &cs :
         {*RGBColorSpace::sRGB, *RGBColorSpace::Rec2020, *RGBColorSpace::ACES2065_1}) {
        for (int i = 0; i < 100; ++i) {
            RGB rgb(rng.Uniform<Float>(), rng.Uniform<Float>(), rng.Uniform<Float>());
            RGBReflectanceSpectrum rs(cs, rgb);

            Float m = rs.MaxValue();
            Float sm = 0;
            for (Float lambda = 360; lambda <= 830; lambda += 1. / 16.)
                sm = std::max(sm, rs(lambda));
            EXPECT_LT(std::abs((sm - m) / sm), 1e-4)
                << "sampled " << sm << " MaxValue " << m << " for " << rs;
        }
    }
}